

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::BatchnormLayerParams::SharedDtor(BatchnormLayerParams *this)

{
  WeightParams *pWVar1;
  Arena *pAVar2;
  LogMessage *other;
  BatchnormLayerParams *pBVar3;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  BatchnormLayerParams *local_10;
  BatchnormLayerParams *this_local;
  
  local_10 = this;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar2 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x646b);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  pBVar3 = internal_default_instance();
  if ((this != pBVar3) && (pWVar1 = this->gamma_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  pBVar3 = internal_default_instance();
  if ((this != pBVar3) && (pWVar1 = this->beta_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  pBVar3 = internal_default_instance();
  if ((this != pBVar3) && (pWVar1 = this->mean_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  pBVar3 = internal_default_instance();
  if ((this != pBVar3) && (pWVar1 = this->variance_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  return;
}

Assistant:

inline void BatchnormLayerParams::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete gamma_;
  if (this != internal_default_instance()) delete beta_;
  if (this != internal_default_instance()) delete mean_;
  if (this != internal_default_instance()) delete variance_;
}